

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  string *__lhs;
  element_type *peVar1;
  bool bVar2;
  char cVar3;
  int64_t iVar4;
  invalid_argument *this;
  shared_ptr<fasttext::FastText> fasttext;
  Autotune autotune;
  string outputFileName;
  Args a;
  ofstream ofs;
  
  ::fasttext::Args::Args(&a);
  ::fasttext::Args::parseArgs(&a,args);
  std::make_shared<fasttext::FastText>();
  outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
  outputFileName._M_string_length = 0;
  outputFileName.field_2._M_local_buf[0] = '\0';
  bVar2 = ::fasttext::Args::hasAutotune(&a);
  if (bVar2) {
    iVar4 = ::fasttext::Args::getAutotuneModelSize(&a);
    if (iVar4 != -1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                     &a.output,".ftz");
      goto LAB_001424b6;
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,&a.output
                 ,".bin");
LAB_001424b6:
  std::__cxx11::string::operator=((string *)&outputFileName,(string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  std::ofstream::ofstream(&ofs,(string *)&outputFileName,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::ofstream::close();
    bVar2 = ::fasttext::Args::hasAutotune(&a);
    if (bVar2) {
      ::fasttext::Autotune::Autotune(&autotune,&fasttext);
      ::fasttext::Autotune::train(&autotune,&a);
      ::fasttext::Autotune::~Autotune(&autotune);
    }
    else {
      ::fasttext::FastText::train
                (fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &a);
    }
    ::fasttext::FastText::saveModel
              (fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &outputFileName);
    peVar1 = fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    __lhs = &a.output;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&autotune,
                   __lhs,".vec");
    ::fasttext::FastText::saveVectors(peVar1,(string *)&autotune);
    std::__cxx11::string::~string((string *)&autotune);
    peVar1 = fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&autotune,
                   __lhs,"_mod.vec");
    ::fasttext::FastText::saveVectorsMod(peVar1,(string *)&autotune);
    std::__cxx11::string::~string((string *)&autotune);
    peVar1 = fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (a.saveSubwords == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&autotune,
                     __lhs,"_subwords.vec");
      ::fasttext::FastText::saveSubWordVectors(peVar1,(string *)&autotune);
      std::__cxx11::string::~string((string *)&autotune);
    }
    if (a.saveOutput == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&autotune,
                     __lhs,".output");
      ::fasttext::FastText::saveOutput
                (fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (string *)&autotune);
      std::__cxx11::string::~string((string *)&autotune);
    }
    std::ofstream::~ofstream(&ofs);
    std::__cxx11::string::~string((string *)&outputFileName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::fasttext::Args::~Args(&a);
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&autotune,
                 &outputFileName," cannot be opened for saving.");
  std::invalid_argument::invalid_argument(this,(string *)&autotune);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  std::shared_ptr<FastText> fasttext = std::make_shared<FastText>();
  std::string outputFileName;

  if (a.hasAutotune() &&
      a.getAutotuneModelSize() != Args::kUnlimitedModelSize) {
    outputFileName = a.output + ".ftz";
  } else {
    outputFileName = a.output + ".bin";
  }
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  if (a.hasAutotune()) {
    Autotune autotune(fasttext);
    autotune.train(a);
  } else {
    fasttext->train(a);
  }
  fasttext->saveModel(outputFileName);
  fasttext->saveVectors(a.output + ".vec");
  fasttext->saveVectorsMod(a.output + "_mod.vec");
  if (a.saveSubwords) {
    fasttext->saveSubWordVectors(a.output + "_subwords.vec");
  }
  if (a.saveOutput) {
    fasttext->saveOutput(a.output + ".output");
  }
}